

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O3

void __thiscall
GameOverIRCCommand::trigger
          (GameOverIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  bool bVar10;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  basic_string_view<char,_std::char_traits<char>_> rhs_03;
  string local_70;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  pcVar7 = channel._M_str;
  sVar8 = channel._M_len;
  lVar3 = Jupiter::IRC::Client::getChannel(source,sVar8,pcVar7);
  if (lVar3 != 0) {
    Jupiter::IRC::Client::Channel::getType();
    RenX::getCore();
    lVar3 = RenX::Core::getServerCount();
    if (lVar3 != 0) {
      bVar2 = false;
      uVar9 = 1;
      local_50 = nick._M_len;
      local_48 = nick._M_str;
      local_40 = sVar8;
      local_38 = pcVar7;
      do {
        uVar4 = RenX::getCore();
        lVar3 = RenX::Core::getServer(uVar4);
        cVar1 = RenX::Server::isLogChanType((int)lVar3);
        if (cVar1 != '\0') {
          rhs._M_str = "empty";
          rhs._M_len = 5;
          bVar2 = jessilib::equalsi<char,char>(parameters,rhs);
          if (bVar2) {
            RenX::Server::gameoverWhenEmpty();
          }
          else {
            rhs_00._M_str = "if empty";
            rhs_00._M_len = 8;
            bVar2 = jessilib::equalsi<char,char>(parameters,rhs_00);
            if (bVar2) {
              lVar3 = *(long *)(lVar3 + 0x20);
              lVar5 = RenX::Server::getBotCount();
              bVar2 = true;
              if (lVar3 == lVar5) {
                RenX::Server::gameover();
              }
              goto LAB_00128f46;
            }
            rhs_01._M_str = "now";
            rhs_01._M_len = 3;
            bVar2 = jessilib::equalsi<char,char>(parameters,rhs_01);
            if (bVar2) {
              RenX::Server::gameover();
            }
            else {
              rhs_02._M_str = "stop";
              rhs_02._M_len = 4;
              bVar2 = jessilib::equalsi<char,char>(parameters,rhs_02);
              if ((bVar2) ||
                 (rhs_03._M_str = "cancel", rhs_03._M_len = 6,
                 bVar2 = jessilib::equalsi<char,char>(parameters,rhs_03), bVar2)) {
                cVar1 = RenX::Server::gameoverStop();
                if (cVar1 == '\0') {
                  Jupiter::IRC::Client::sendNotice
                            (source,local_50,local_48,0x26,"Error: There is no gameover scheduled.")
                  ;
                }
                else {
                  RenX::Server::sendMessage
                            (lVar3,0x32,"Notice: The scheduled gameover has been cancelled.");
                }
              }
              else {
                if (parameters._M_len == 0) {
                  uVar6 = 10;
                }
                else {
                  uVar6 = Jupiter_strtoll_s(parameters._M_str,parameters._M_len,0);
                }
                string_printf_abi_cxx11_
                          (&local_70,"Notice: This server will gameover in %lld seconds.",uVar6);
                RenX::Server::sendMessage(lVar3,local_70._M_string_length,local_70._M_dataplus._M_p)
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                RenX::Server::gameover(lVar3,uVar6);
              }
            }
          }
          bVar2 = true;
        }
LAB_00128f46:
        RenX::getCore();
        uVar4 = RenX::Core::getServerCount();
        bVar10 = uVar4 != uVar9;
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (bVar10);
      pcVar7 = local_38;
      sVar8 = local_40;
      if (bVar2) {
        return;
      }
    }
    Jupiter::IRC::Client::sendMessage
              (source,sVar8,pcVar7,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
  }
  return;
}

Assistant:

void GameOverIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters)
{
	Jupiter::IRC::Client::Channel *chan = source->getChannel(channel);
	if (chan != nullptr)
	{
		int type = chan->getType();
		bool match = false;
		std::chrono::seconds delay;

		for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
		{
			RenX::Server *server = RenX::getCore()->getServer(i);
			if (server->isLogChanType(type))
			{
				match = true;
				if (jessilib::equalsi(parameters, "empty"sv))
					server->gameoverWhenEmpty();
				else if (jessilib::equalsi(parameters, "if empty"sv))
				{
					if (server->players.size() == server->getBotCount())
						server->gameover();
				}
				else if (jessilib::equalsi(parameters, "now"sv))
					server->gameover();
				else if (jessilib::equalsi(parameters, "stop"sv) || jessilib::equalsi(parameters, "cancel"sv))
				{
					if (server->gameoverStop())
						server->sendMessage("Notice: The scheduled gameover has been cancelled."sv);
					else
						source->sendNotice(nick, "Error: There is no gameover scheduled."sv);
				}
				else
				{
					if (parameters.empty())
						delay = std::chrono::seconds(10);
					else
						delay = std::chrono::seconds(Jupiter::from_string<long long>(parameters));

					server->sendMessage(string_printf("Notice: This server will gameover in %lld seconds.", static_cast<long long>(delay.count())));
					server->gameover(delay);
				}
			}
		}
		if (match == false)
			source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
	}
}